

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

void __thiscall
ContainerAlgorithms::
DefaultDeleter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>,_true>
::operator()(DefaultDeleter<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependInformation_*>_>_>,_true>
             *this,value_type *value)

{
  cmDependInformation *this_00;
  
  this_00 = value->second;
  if (this_00 != (cmDependInformation *)0x0) {
    cmDependInformation::~cmDependInformation(this_00);
  }
  operator_delete(this_00,0xa0);
  return;
}

Assistant:

void operator()(typename Range::value_type value) const {
    delete value.second;
  }